

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# use_wrapper.h
# Opt level: O1

double L18_4::use_f<double,L18_4::Fq>(double v,Fq f)

{
  ostream *poVar1;
  
  use_f<double,_L18_4::Fq>::count = use_f<double,_L18_4::Fq>::count + 1;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," use_f count = ",0xf);
  poVar1 = (ostream *)std::ostream::operator<<(&std::cout,use_f<double,_L18_4::Fq>::count);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,", &count = ",0xb);
  poVar1 = std::ostream::_M_insert<void_const*>(poVar1);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  return v * f._z;
}

Assistant:

T use_f(T v, F f) {
        static int count = 0;
        count ++;
        std::cout << " use_f count = " << count << ", &count = " << &count << std::endl;
        return f(v);
    }